

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O0

void __thiscall
ADynamicLight::CollectWithinRadius
          (ADynamicLight *this,DVector3 *pos,subsector_t *subSec,float radius)

{
  FPolyNode *pFVar1;
  sector_t *psVar2;
  subsector_t *subSec_00;
  bool bVar3;
  FLightNode *pFVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  DVector3 local_1c8;
  subsector_t *local_1b0;
  subsector_t *othersub_2;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [8];
  DVector2 refpos_1;
  line_t *other_2;
  DAngle local_128;
  subsector_t *othersub_1;
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [8];
  DVector2 refpos;
  line_t *other_1;
  sector_t *sec;
  subsector_t *sub;
  seg_t *partner;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  anon_union_8_2_947301c2_for_TObjPtr<DSectorEffect>_1 local_48;
  subsector_t *othersub;
  line_t *other;
  FLinePortal *port;
  seg_t *seg;
  uint i;
  float radius_local;
  subsector_t *subSec_local;
  DVector3 *pos_local;
  ADynamicLight *this_local;
  
  if (subSec != (subsector_t *)0x0) {
    subSec->validcount = validcount;
    seg._4_4_ = radius;
    _i = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)subSec;
    subSec_local = (subsector_t *)pos;
    pos_local = (DVector3 *)this;
    pFVar4 = AddLightNode(&subSec->lighthead,subSec,this,&this->touching_subsectors);
    this->touching_subsectors = pFVar4;
    if (((sector_t *)(_i->super_DObject)._vptr_DObject)->validcount != validcount) {
      pFVar4 = AddLightNode(&(*(sector_t **)&(_i->super_DObject).ObjectFlags)->lighthead,
                            (sector_t *)(_i->super_DObject)._vptr_DObject,this,
                            &this->touching_sector);
      this->touching_sector = pFVar4;
      ((sector_t *)(_i->super_DObject)._vptr_DObject)->validcount = validcount;
    }
    for (seg._0_4_ = 0; (uint)seg < *(uint *)&(_i->Next).field_0; seg._0_4_ = (uint)seg + 1) {
      port = (FLinePortal *)((seg_t *)(_i->super_DObject).GCNext + (uint)seg);
      dVar5 = DistToSeg(this,(DVector3 *)subSec_local,(seg_t *)port);
      if (dVar5 <= (double)seg._4_4_) {
        if ((((port->mDisplacement).X != 0.0) && ((port->mDisplacement).Y != 0.0)) &&
           (*(int *)((long)(port->mDisplacement).Y + 0x88) != validcount)) {
          pFVar1 = subSec_local->polys;
          dVar5 = vertex_t::fY((vertex_t *)port->mOrigin);
          dVar6 = vertex_t::fX((vertex_t *)port->mDestination);
          dVar7 = vertex_t::fX((vertex_t *)port->mOrigin);
          dVar8 = vertex_t::fX((vertex_t *)port->mOrigin);
          psVar2 = subSec_local->sector;
          dVar9 = vertex_t::fY((vertex_t *)port->mDestination);
          dVar10 = vertex_t::fY((vertex_t *)port->mOrigin);
          if (((double)pFVar1 - dVar5) * (dVar6 - dVar7) +
              (dVar8 - (double)psVar2) * (dVar9 - dVar10) <= 0.0) {
            *(int *)((long)(port->mDisplacement).Y + 0x88) = validcount;
            pFVar4 = AddLightNode((FLightNode **)((long)(port->mDisplacement).X + 0xc0),
                                  (void *)(port->mDisplacement).X,this,&this->touching_sides);
            this->touching_sides = pFVar4;
          }
        }
        if ((((port->mDisplacement).Y != 0.0) &&
            (other = (line_t *)line_t::getPortal((line_t *)(port->mDisplacement).Y),
            other != (line_t *)0x0)) &&
           (((BYTE)other->flags == '\x03' &&
            (othersub = (subsector_t *)other->v2, ((line_t *)othersub)->validcount != validcount))))
        {
          vertex_t::fPos((vertex_t *)local_68);
          line_t::Delta((line_t *)local_88);
          TVector2<double>::operator/((TVector2<double> *)(local_88 + 0x10),2.0);
          TVector2<double>::operator+
                    ((TVector2<double> *)(local_68 + 0x10),(TVector2<double> *)local_68);
          local_48.p = (DSectorEffect *)R_PointInSubsector((DVector2 *)(local_68 + 0x10));
          if (*(int *)&(local_48.p)->m_Sector != validcount) {
            AActor::PosRelative((DVector3 *)&partner,&this->super_AActor,(line_t *)othersub);
            CollectWithinRadius(this,(DVector3 *)&partner,(subsector_t *)local_48.p,seg._4_4_);
          }
        }
        if (((port->mSinRot != 0.0) &&
            (subSec_00 = *(subsector_t **)((long)port->mSinRot + 0x38),
            subSec_00 != (subsector_t *)0x0)) && (subSec_00->validcount != validcount)) {
          CollectWithinRadius(this,(DVector3 *)subSec_local,subSec_00,seg._4_4_);
        }
      }
    }
    psVar2 = (sector_t *)(_i->super_DObject)._vptr_DObject;
    bVar3 = sector_t::PortalBlocksSight(psVar2,1);
    if (!bVar3) {
      refpos.Y = (double)((seg_t *)_i->GCNext)->linedef;
      dVar5 = sector_t::GetPortalPlaneZ(psVar2,1);
      dVar6 = AActor::Z(&this->super_AActor);
      if (dVar5 < dVar6 + (double)seg._4_4_) {
        vertex_t::fPos((vertex_t *)local_f0);
        line_t::Delta((line_t *)local_110);
        TVector2<double>::operator/((TVector2<double> *)(local_110 + 0x10),2.0);
        TVector2<double>::operator+
                  ((TVector2<double> *)(local_f0 + 0x10),(TVector2<double> *)local_f0);
        sector_t::GetPortalDisplacement((sector_t *)&othersub_1,(int)psVar2);
        TVector2<double>::operator+
                  ((TVector2<double> *)local_d0,(TVector2<double> *)(local_f0 + 0x10));
        local_128.Degrees = (double)R_PointInSubsector((DVector2 *)local_d0);
        if (((subsector_t *)local_128.Degrees)->validcount != validcount) {
          AActor::PosRelative((DVector3 *)&other_2,&this->super_AActor,
                              ((subsector_t *)local_128.Degrees)->sector);
          CollectWithinRadius(this,(DVector3 *)&other_2,(subsector_t *)local_128.Degrees,seg._4_4_);
        }
      }
    }
    bVar3 = sector_t::PortalBlocksSight(psVar2,0);
    if (!bVar3) {
      refpos_1.Y = (double)((seg_t *)_i->GCNext)->linedef;
      dVar5 = sector_t::GetPortalPlaneZ(psVar2,0);
      dVar6 = AActor::Z(&this->super_AActor);
      if (dVar6 - (double)seg._4_4_ < dVar5) {
        vertex_t::fPos((vertex_t *)local_178);
        line_t::Delta((line_t *)local_198);
        TVector2<double>::operator/((TVector2<double> *)(local_198 + 0x10),2.0);
        TVector2<double>::operator+
                  ((TVector2<double> *)(local_178 + 0x10),(TVector2<double> *)local_178);
        sector_t::GetPortalDisplacement((sector_t *)&othersub_2,(int)psVar2);
        TVector2<double>::operator+
                  ((TVector2<double> *)local_158,(TVector2<double> *)(local_178 + 0x10));
        local_1b0 = R_PointInSubsector((DVector2 *)local_158);
        if (local_1b0->validcount != validcount) {
          AActor::PosRelative(&local_1c8,&this->super_AActor,local_1b0->sector);
          CollectWithinRadius(this,&local_1c8,local_1b0,seg._4_4_);
        }
      }
    }
  }
  return;
}

Assistant:

void ADynamicLight::CollectWithinRadius(const DVector3 &pos, subsector_t *subSec, float radius)
{
	if (!subSec) return;

	subSec->validcount = ::validcount;

	touching_subsectors = AddLightNode(&subSec->lighthead, subSec, this, touching_subsectors);
	if (subSec->sector->validcount != ::validcount)
	{
		touching_sector = AddLightNode(&subSec->render_sector->lighthead, subSec->sector, this, touching_sector);
		subSec->sector->validcount = ::validcount;
	}

	for (unsigned int i = 0; i < subSec->numlines; i++)
	{
		seg_t * seg = subSec->firstline + i;

		// check distance from x/y to seg and if within radius add this seg and, if present the opposing subsector (lather/rinse/repeat)
		// If out of range we do not need to bother with this seg.
		if (DistToSeg(pos, seg) <= radius)
		{
			if (seg->sidedef && seg->linedef && seg->linedef->validcount != ::validcount)
			{
				// light is in front of the seg
				if ((pos.Y - seg->v1->fY()) * (seg->v2->fX() - seg->v1->fX()) + (seg->v1->fX() - pos.X) * (seg->v2->fY() - seg->v1->fY()) <= 0)
				{
					seg->linedef->validcount = validcount;
					touching_sides = AddLightNode(&seg->sidedef->lighthead, seg->sidedef, this, touching_sides);
				}
			}
			if (seg->linedef)
			{
				FLinePortal *port = seg->linedef->getPortal();
				if (port && port->mType == PORTT_LINKED)
				{
					line_t *other = port->mDestination;
					if (other->validcount != ::validcount)
					{
						subsector_t *othersub = R_PointInSubsector(other->v1->fPos() + other->Delta() / 2);
						if (othersub->validcount != ::validcount) CollectWithinRadius(PosRelative(other), othersub, radius);
					}
				}
			}

			seg_t *partner = seg->PartnerSeg;
			if (partner)
			{
				subsector_t *sub = partner->Subsector;
				if (sub != NULL && sub->validcount != ::validcount)
				{
					CollectWithinRadius(pos, sub, radius);
				}
			}
		}
	}
	sector_t *sec = subSec->sector;
	if (!sec->PortalBlocksSight(sector_t::ceiling))
	{
		line_t *other = subSec->firstline->linedef;
		if (sec->GetPortalPlaneZ(sector_t::ceiling) < Z() + radius)
		{
			DVector2 refpos = other->v1->fPos() + other->Delta() / 2 + sec->GetPortalDisplacement(sector_t::ceiling);
			subsector_t *othersub = R_PointInSubsector(refpos);
			if (othersub->validcount != ::validcount) CollectWithinRadius(PosRelative(othersub->sector), othersub, radius);
		}
	}
	if (!sec->PortalBlocksSight(sector_t::floor))
	{
		line_t *other = subSec->firstline->linedef;
		if (sec->GetPortalPlaneZ(sector_t::floor) > Z() - radius)
		{
			DVector2 refpos = other->v1->fPos() + other->Delta() / 2 + sec->GetPortalDisplacement(sector_t::floor);
			subsector_t *othersub = R_PointInSubsector(refpos);
			if (othersub->validcount != ::validcount) CollectWithinRadius(PosRelative(othersub->sector), othersub, radius);
		}
	}
}